

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializeWorldActors(FArchive *arc)

{
  FArchive *pFVar1;
  int iVar2;
  FSectorPortal *s;
  TObjPtr<ASectorAction> *object;
  FSectorPortal *pFVar3;
  line_t *plVar4;
  long lVar5;
  
  object = &sectors->SecActTarget;
  for (iVar2 = 0; iVar2 < numsectors; iVar2 = iVar2 + 1) {
    pFVar1 = operator<<(arc,(AActor **)(object + -0x1c));
    pFVar1 = operator<<(pFVar1,(ASectorAction **)object);
    pFVar1 = operator<<(pFVar1,(DSectorEffect **)(object + -0x12));
    pFVar1 = operator<<(pFVar1,(DSectorEffect **)(object + -0x11));
    operator<<(pFVar1,(DSectorEffect **)(object + -0x10));
    object = object + 0x4d;
  }
  pFVar3 = sectorPortals.Array;
  for (lVar5 = (ulong)sectorPortals.Count << 6; lVar5 != 0; lVar5 = lVar5 + -0x40) {
    operator<<(arc,(AActor **)&pFVar3->mSkybox);
    pFVar3 = pFVar3 + 1;
  }
  plVar4 = lines;
  for (iVar2 = 0; lVar5 = 9, iVar2 < numlines; iVar2 = iVar2 + 1) {
    for (; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      if (*(long *)(plVar4->args + lVar5 * 2 + -0xb) != 0) {
        DBaseDecal::SerializeChain
                  (arc,(DBaseDecal **)(*(long *)(plVar4->args + lVar5 * 2 + -0xb) + 8));
      }
    }
    plVar4 = plVar4 + 1;
  }
  return;
}

Assistant:

void P_SerializeWorldActors(FArchive &arc)
{
	int i;
	sector_t *sec;
	line_t *line;

	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->SoundTarget
			<< sec->SecActTarget
			<< sec->floordata
			<< sec->ceilingdata
			<< sec->lightingdata;
	}
	for (auto &s : sectorPortals)
	{
		arc << s.mSkybox;
	}
	for (i = 0, line = lines; i < numlines; i++, line++)
	{
		for (int s = 0; s < 2; s++)
		{
			if (line->sidedef[s] != NULL)
			{
				DBaseDecal::SerializeChain(arc, &line->sidedef[s]->AttachedDecals);
			}
		}
	}
}